

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O0

void __thiscall rtosc::UndoHistoryImpl::rewind(UndoHistoryImpl *this,FILE *__stream)

{
  rtosc_arg_t rVar1;
  rtosc_arg_t *in_stack_00000018;
  char *in_stack_00000020;
  rtosc_arg_t arg;
  char *in_stack_00000038;
  char *in_stack_ffffffffffffffb8;
  function<void_(const_char_*)> *this_00;
  uint idx;
  char *in_stack_ffffffffffffffd0;
  
  idx = (uint)((ulong)this >> 0x20);
  memset(tmp,0,0x100);
  rtosc_argument(in_stack_ffffffffffffffd0,idx);
  rVar1 = rtosc_argument(in_stack_ffffffffffffffd0,idx);
  this_00 = (function<void_(const_char_*)> *)rVar1.s;
  rtosc_argument_string((char *)__stream);
  rtosc_amessage(in_stack_00000038,(size_t)arg.b.data,arg.s,in_stack_00000020,in_stack_00000018);
  std::function<void_(const_char_*)>::operator()(this_00,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void UndoHistoryImpl::rewind(const char *msg)
{
    memset(tmp, 0, sizeof(tmp));
    rtosc_arg_t arg = rtosc_argument(msg,1);
    rtosc_amessage(tmp, 256, rtosc_argument(msg,0).s,
            rtosc_argument_string(msg)+2,
            &arg);
    cb(tmp);
}